

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct32_high24_stage5_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i w1;
  __m256i _r_00;
  __m256i _r_01;
  undefined4 uVar4;
  int32_t cos_bit_00;
  undefined4 uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  
  uVar5 = 0x61ff138;
  uVar4 = 0xf138f9e1;
  alVar1[1] = in_XMM0_Qb;
  alVar1[0] = in_XMM0_Qa;
  alVar1[2] = in_YMM0_H;
  alVar1[3] = in_register_00001218;
  alVar3[1]._0_4_ = 0x61ff138;
  alVar3[0] = 0x61ff138061ff138;
  alVar3[1]._4_4_ = 0x61ff138;
  alVar3[2]._0_4_ = 0x61ff138;
  alVar3[2]._4_4_ = 0x61ff138;
  alVar3[3]._0_4_ = 0x61ff138;
  alVar3[3]._4_4_ = 0x61ff138;
  _r_00[1]._0_4_ = 0xf138f9e1;
  _r_00[0] = 0xf138f9e1f138f9e1;
  _r_00[1]._4_4_ = 0xf138f9e1;
  _r_00[2]._0_4_ = 0xf138f9e1;
  _r_00[2]._4_4_ = 0xf138f9e1;
  _r_00[3]._0_4_ = 0xf138f9e1;
  _r_00[3]._4_4_ = 0xf138f9e1;
  uVar6 = uVar5;
  uVar7 = uVar5;
  uVar8 = uVar5;
  uVar9 = uVar5;
  uVar10 = uVar5;
  uVar11 = uVar5;
  uVar12 = uVar5;
  uVar13 = uVar4;
  uVar14 = uVar4;
  uVar15 = uVar4;
  uVar16 = uVar4;
  uVar17 = uVar4;
  uVar18 = uVar4;
  uVar19 = uVar4;
  btf_16_w16_avx2(alVar1,alVar3,x + 9,x + 0xe,_r_00,0xf138);
  alVar2[1] = in_XMM0_Qb;
  alVar2[0] = in_XMM0_Qa;
  alVar2[2] = in_YMM0_H;
  alVar2[3] = in_register_00001218;
  w1[0]._4_4_ = uVar6;
  w1[0]._0_4_ = uVar5;
  w1[1]._0_4_ = uVar7;
  w1[1]._4_4_ = uVar8;
  w1[2]._0_4_ = uVar9;
  w1[2]._4_4_ = uVar10;
  w1[3]._0_4_ = uVar11;
  w1[3]._4_4_ = uVar12;
  _r_01[0]._4_4_ = uVar13;
  _r_01[0]._0_4_ = uVar4;
  _r_01[1]._0_4_ = uVar14;
  _r_01[1]._4_4_ = uVar15;
  _r_01[2]._0_4_ = uVar16;
  _r_01[2]._4_4_ = uVar17;
  _r_01[3]._0_4_ = uVar18;
  _r_01[3]._4_4_ = uVar19;
  btf_16_w16_avx2(alVar2,w1,x + 10,x + 0xd,_r_01,cos_bit_00);
  alVar1 = x[0x10];
  alVar2 = x[0x11];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x13]);
  x[0x10] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x13]);
  x[0x13] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x12]);
  x[0x11] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x12]);
  x[0x12] = alVar1;
  alVar1 = x[0x17];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x14]);
  x[0x17] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x14]);
  x[0x14] = alVar1;
  alVar1 = x[0x16];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x15]);
  x[0x16] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x15]);
  x[0x15] = alVar1;
  alVar1 = x[0x18];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1b]);
  x[0x18] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1b]);
  x[0x1b] = alVar1;
  alVar1 = x[0x19];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1a]);
  x[0x19] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1a]);
  x[0x1a] = alVar1;
  alVar1 = x[0x1f];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1c]);
  x[0x1f] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1c]);
  x[0x1c] = alVar1;
  alVar1 = x[0x1e];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1d]);
  x[0x1e] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x1d]);
  x[0x1d] = alVar1;
  return;
}

Assistant:

static inline void idct32_high24_stage5_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[16], &x[19]);
  btf_16_adds_subs_avx2(&x[17], &x[18]);
  btf_16_adds_subs_avx2(&x[23], &x[20]);
  btf_16_adds_subs_avx2(&x[22], &x[21]);
  btf_16_adds_subs_avx2(&x[24], &x[27]);
  btf_16_adds_subs_avx2(&x[25], &x[26]);
  btf_16_adds_subs_avx2(&x[31], &x[28]);
  btf_16_adds_subs_avx2(&x[30], &x[29]);
}